

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_change_directory(char *path)

{
  int iVar1;
  char *in_RDI;
  int ret;
  
  iVar1 = chdir(in_RDI);
  if (iVar1 == -1) {
    __errno_location();
    al_set_errno((int)((ulong)in_RDI >> 0x20));
  }
  return iVar1 != -1;
}

Assistant:

static bool fs_stdio_change_directory(const char *path)
{
   int ret = -1;

#ifdef ALLEGRO_WINDOWS
   wchar_t *wpath = _al_win_utf8_to_utf16(path);
   if (wpath) {
      ret = _wchdir(wpath);
      al_free(wpath);
   }
#else
   ret = chdir(path);
#endif

   if (ret == -1) {
      al_set_errno(errno);
      return false;
   }

   return true;
}